

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O3

void __thiscall
rr::FragmentProcessor::executeColorWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,bool isSRGB,PixelBufferAccess *colorBuffer)

{
  ulong uVar1;
  int i;
  long lVar2;
  ulong uVar3;
  Vec3 *pVVar4;
  Vec4 local_68;
  Fragment *local_58;
  PixelBufferAccess *local_50;
  tcu local_48 [8];
  float afStack_40 [4];
  
  pVVar4 = &this->m_sampleRegister[0].blendedRGB;
  uVar3 = 0;
  local_58 = inputFragments;
  local_50 = colorBuffer;
  do {
    if (this->m_sampleRegister[uVar3].isAlive == true) {
      uVar1 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.0;
      local_68.m_data[0] = 0.0;
      local_68.m_data[1] = 0.0;
      afStack_40[0] = 0.0;
      afStack_40[1] = 1.4013e-45;
      afStack_40[2] = 2.8026e-45;
      lVar2 = 0;
      do {
        local_68.m_data[(int)afStack_40[lVar2]] = pVVar4->m_data[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      local_68.m_data[3] = this->m_sampleRegister[uVar3].blendedA;
      if (isSRGB) {
        tcu::linearToSRGB(local_48,&local_68);
        local_68.m_data._0_8_ = local_48;
        local_68.m_data[2] = afStack_40[0];
        local_68.m_data[3] = afStack_40[1];
      }
      tcu::PixelBufferAccess::setPixel
                (local_50,&local_68,(int)((long)uVar1 % (long)numSamplesPerFragment),
                 local_58[(int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset].
                 pixelCoord.m_data[0],
                 local_58[(int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset].
                 pixelCoord.m_data[1]);
    }
    uVar3 = uVar3 + 1;
    pVVar4 = pVVar4 + 0xb;
  } while (uVar3 != 0x40);
  return;
}

Assistant:

void FragmentProcessor::executeColorWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, bool isSRGB, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			Vec4				combinedColor;

			combinedColor.xyz()	= m_sampleRegister[regSampleNdx].blendedRGB;
			combinedColor.w()	= m_sampleRegister[regSampleNdx].blendedA;

			if (isSRGB)
				combinedColor = tcu::linearToSRGB(combinedColor);

			colorBuffer.setPixel(combinedColor, fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}